

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_buffer.cpp
# Opt level: O3

bool dxil_spv::emit_atomic_cmpxchg_instruction(Impl *impl,CallInst *instruction)

{
  StorageClass storage;
  uint uVar1;
  undefined1 component_type_00;
  bool bVar2;
  Id IVar3;
  RawWidth width;
  Id IVar4;
  Builder *this;
  Value *pVVar5;
  mapped_type *meta;
  Type *pTVar6;
  BufferAccessInfo BVar7;
  Operation *this_00;
  ulong uVar8;
  uint32_t num_coords_full;
  Id image_id;
  ComponentType component_type;
  uint32_t num_coords;
  Id coords [3];
  uint32_t local_60;
  Id local_5c;
  Id local_58;
  Capability local_54;
  uint32_t local_50;
  Id local_4c;
  Id local_48 [4];
  mapped_type *local_38;
  
  this = Converter::Impl::builder(impl);
  pVVar5 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
  local_5c = Converter::Impl::get_id_for_value(impl,pVVar5,0);
  if (local_5c == (impl->ags).magic_ptr_id) {
    bVar2 = emit_magic_ags_instruction(impl,instruction);
    return bVar2;
  }
  meta = std::__detail::
         _Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
         ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       *)&impl->handle_to_resource_meta,&local_5c);
  emit_buffer_synchronization_validation(impl,instruction,AtomicRMW);
  local_48[2] = 0;
  local_48[0] = 0;
  local_48[1] = 0;
  local_60 = 0;
  local_50 = 0;
  if ((byte)(meta->kind - TypedBuffer) < 3) {
    IVar3 = meta->index_offset_id;
    pTVar6 = LLVMBC::Value::getType((Value *)instruction);
    BVar7 = build_buffer_access(impl,instruction,0,IVar3,pTVar6,1);
    local_48[0] = BVar7.index_id;
    local_50 = 1;
    local_60 = 1;
  }
  else {
    bVar2 = get_image_dimensions(impl,local_5c,&local_60,&local_50);
    if (3 < local_60 || !bVar2) {
      return false;
    }
    if (local_60 != 0) {
      uVar8 = 0;
      do {
        pVVar5 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,(int)uVar8 + 2);
        IVar3 = Converter::Impl::get_id_for_value(impl,pVVar5,0);
        local_48[uVar8] = IVar3;
        uVar8 = uVar8 + 1;
      } while (uVar8 < local_60);
    }
  }
  IVar3 = spv::Builder::makeIntegerType(this,0x20,false);
  IVar3 = Converter::Impl::build_vector(impl,IVar3,local_48,local_60);
  storage = meta->storage;
  pTVar6 = LLVMBC::Value::getType((Value *)instruction);
  uVar1._0_1_ = (impl->execution_mode_meta).native_16bit_operations;
  uVar1._1_1_ = (impl->execution_mode_meta).synthesize_2d_quad_dispatch;
  uVar1._2_1_ = (impl->execution_mode_meta).synthesize_dummy_derivatives;
  uVar1._3_1_ = (impl->execution_mode_meta).field_0x33;
  width = get_buffer_access_bits_per_component((Impl *)(ulong)uVar1,storage,pTVar6);
  if (width == B64) {
    local_54 = CapabilityInt64Atomics;
    std::
    _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
    ::_M_insert_unique<spv::Capability_const&>
              ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
                *)&this->capabilities,&local_54);
    width = B64;
  }
  IVar3 = emit_atomic_access_chain(impl,meta,width,local_5c,IVar3,(ComponentType *)&local_54);
  local_38 = meta;
  if (meta->non_uniform == true) {
    spv::Builder::addDecoration(this,IVar3,DecorationNonUniform,-1);
  }
  component_type_00 = (undefined1)local_54;
  IVar4 = Converter::Impl::get_type_id(impl,(undefined1)local_54,1,1,false);
  this_00 = Converter::Impl::allocate(impl,OpAtomicCompareExchange,(Value *)instruction,IVar4);
  pVVar5 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,5);
  local_58 = Converter::Impl::get_id_for_value(impl,pVVar5,0);
  pVVar5 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,6);
  IVar4 = Converter::Impl::get_id_for_value(impl,pVVar5,0);
  local_4c = IVar3;
  local_58 = Converter::Impl::fixup_store_type_atomic(impl,component_type_00,1,local_58);
  IVar3 = Converter::Impl::fixup_store_type_atomic(impl,component_type_00,1,IVar4);
  Operation::add_id(this_00,local_4c);
  IVar4 = spv::Builder::makeIntegerType(this,0x20,false);
  IVar4 = spv::Builder::makeIntConstant(this,IVar4,1,false);
  Operation::add_id(this_00,IVar4);
  IVar4 = spv::Builder::makeIntegerType(this,0x20,false);
  IVar4 = spv::Builder::makeIntConstant(this,IVar4,0,false);
  Operation::add_id(this_00,IVar4);
  IVar4 = spv::Builder::makeIntegerType(this,0x20,false);
  IVar4 = spv::Builder::makeIntConstant(this,IVar4,0,false);
  Operation::add_id(this_00,IVar4);
  Operation::add_id(this_00,IVar3);
  Operation::add_id(this_00,local_58);
  Converter::Impl::add(impl,this_00,local_38->rov);
  Converter::Impl::fixup_load_type_atomic(impl,component_type_00,1,(Value *)instruction);
  return true;
}

Assistant:

bool emit_atomic_cmpxchg_instruction(Converter::Impl &impl, const llvm::CallInst *instruction)
{
	auto &builder = impl.builder();
	spv::Id image_id = impl.get_id_for_value(instruction->getOperand(1));

	if (image_id == impl.ags.magic_ptr_id)
		return emit_magic_ags_instruction(impl, instruction);

	const auto &meta = impl.handle_to_resource_meta[image_id];

	emit_buffer_synchronization_validation(impl, instruction, BDAOperation::AtomicRMW);

	spv::Id coords[3] = {};
	uint32_t num_coords_full = 0, num_coords = 0;

	if (meta.kind == DXIL::ResourceKind::StructuredBuffer ||
	    meta.kind == DXIL::ResourceKind::RawBuffer ||
	    meta.kind == DXIL::ResourceKind::TypedBuffer)
	{
		auto access = build_buffer_access(impl, instruction, 0, meta.index_offset_id, instruction->getType(), 1);
		coords[0] = access.index_id;
		num_coords = 1;
		num_coords_full = 1;
	}
	else
	{
		if (!get_image_dimensions(impl, image_id, &num_coords_full, &num_coords))
			return false;

		if (num_coords_full > 3)
			return false;

		for (uint32_t i = 0; i < num_coords_full; i++)
			coords[i] = impl.get_id_for_value(instruction->getOperand(2 + i));
	}

	spv::Id coord = impl.build_vector(builder.makeUintType(32), coords, num_coords_full);

	auto width = get_buffer_access_bits_per_component(impl, meta.storage, instruction->getType());
	if (width == RawWidth::B64)
		builder.addCapability(spv::CapabilityInt64Atomics);

	DXIL::ComponentType component_type;
	spv::Id counter_ptr_id = emit_atomic_access_chain(impl, meta, width, image_id, coord, component_type);

	if (meta.non_uniform)
		builder.addDecoration(counter_ptr_id, spv::DecorationNonUniformEXT);

	Operation *op =
	    impl.allocate(spv::OpAtomicCompareExchange, instruction, impl.get_type_id(component_type, 1, 1));

	spv::Id comparison_id = impl.get_id_for_value(instruction->getOperand(5));
	spv::Id new_value_id = impl.get_id_for_value(instruction->getOperand(6));
	comparison_id = impl.fixup_store_type_atomic(component_type, 1, comparison_id);
	new_value_id = impl.fixup_store_type_atomic(component_type, 1, new_value_id);

	op->add_id(counter_ptr_id);
	op->add_id(builder.makeUintConstant(spv::ScopeDevice));
	op->add_id(builder.makeUintConstant(0));
	op->add_id(builder.makeUintConstant(0));
	op->add_id(new_value_id);
	op->add_id(comparison_id);
	impl.add(op, meta.rov);
	impl.fixup_load_type_atomic(component_type, 1, instruction);
	return true;
}